

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

Statement * rsg::anon_unknown_0::createStatement(GeneratorState *state)

{
  StatementSpec *pSVar1;
  Statement *pSVar2;
  GeneratorState *state_local;
  
  pSVar1 = chooseStatement(state);
  pSVar2 = (*pSVar1->create)(state);
  return pSVar2;
}

Assistant:

Statement* createStatement (GeneratorState& state)
{
	return chooseStatement(state)->create(state);
}